

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

void __thiscall
CVmObjFrameDesc::restore_from_file
          (CVmObjFrameDesc *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  uint uVar1;
  CVmFile *in_RCX;
  undefined8 in_RDI;
  uint ret_ofs;
  int frame_idx;
  vm_obj_id_t fref;
  undefined4 in_stack_ffffffffffffffd0;
  vm_obj_id_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  CVmFile::read_uint4(in_RCX);
  CVmObjFixup::get_new_id
            ((CVmObjFixup *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd4);
  CVmFile::read_int2(in_RCX);
  uVar1 = CVmFile::read_uint2(in_RCX);
  alloc_ext((CVmObjFrameDesc *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
            (vm_obj_id_t)((ulong)in_RDI >> 0x20),(int)in_RDI,(uint)((ulong)in_RCX >> 0x20));
  return;
}

Assistant:

void CVmObjFrameDesc::restore_from_file(VMG_ vm_obj_id_t self,
                                        class CVmFile *fp,
                                        class CVmObjFixup *fixups)
{
    /* read the values */
    vm_obj_id_t fref = fixups->get_new_id(vmg_ (vm_obj_id_t)fp->read_uint4());
    int frame_idx = fp->read_int2();
    uint ret_ofs = fp->read_uint2();

    /* allocate the extension */
    alloc_ext(vmg_ fref, frame_idx, ret_ofs);
}